

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

size_t Base32ToByteStream(char *inBuf,size_t len,uint8_t *outBuf,size_t outLen)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  ulong in_R11;
  
  iVar5 = 0;
  if (len == 0) {
    return 0;
  }
  sVar8 = 0;
  uVar3 = 0;
  uVar9 = 0;
  do {
    cVar1 = inBuf[sVar8];
    if ((byte)(cVar1 - 0x32U) < 6) {
      bVar6 = cVar1 - 0x18;
LAB_00104928:
      uVar9 = uVar9 | bVar6;
      iVar7 = iVar5 + 5;
      if (2 < iVar5) {
        if (outLen <= uVar3) {
          bVar2 = false;
          in_R11 = uVar3;
          iVar5 = iVar7;
          goto LAB_00104964;
        }
        iVar7 = iVar5 + -3;
        outBuf[uVar3] = (uint8_t)((int)uVar9 >> ((byte)iVar7 & 0x1f));
        uVar3 = uVar3 + 1;
      }
      uVar9 = uVar9 << 5;
      bVar2 = true;
      iVar5 = iVar7;
    }
    else {
      bVar6 = cVar1 + 0x9f;
      if (bVar6 < 0x1a) goto LAB_00104928;
      bVar2 = false;
      in_R11 = 0;
    }
LAB_00104964:
    uVar4 = in_R11;
    if ((!bVar2) || (sVar8 = sVar8 + 1, uVar4 = uVar3, len == sVar8)) {
      return uVar4;
    }
  } while( true );
}

Assistant:

size_t Base32ToByteStream (const char * inBuf, size_t len, uint8_t * outBuf, size_t outLen)
	{
		int tmp = 0, bits = 0;
		size_t ret = 0;
		for (size_t i = 0; i < len; i++)
		{
			char ch = inBuf[i];
			if (ch >= '2' && ch <= '7') // digit
				ch = (ch - '2') + 26; // 26 means a-z
			else if (ch >= 'a' && ch <= 'z')
				ch = ch - 'a'; // a = 0
			else
				return 0; // unexpected character

			tmp |= ch;
			bits += 5;
			if (bits >= 8)
			{
				if (ret >= outLen) return ret;
				outBuf[ret] = tmp >> (bits - 8);
				bits -= 8;
				ret++;
			}
			tmp <<= 5;
		}
		return ret;
	}